

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetLanguageFlags(cmMakefileTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmGeneratedFileStream *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference pbVar4;
  ostream *poVar5;
  undefined1 local_140 [8];
  string includes;
  string defines;
  string flags;
  _Self local_d8;
  const_iterator l_1;
  undefined1 local_c8 [8];
  string compiler;
  _Self local_a0;
  const_iterator l;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmMakefileTargetGenerator *this_local;
  
  languages._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40);
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"CMAKE_BUILD_TYPE",&local_81);
  pcVar3 = cmMakefile::GetSafeDefinition(this_01,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar3,(allocator *)((long)&l._M_node + 3));
  cmGeneratorTarget::GetLanguages
            (this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&l._M_node + 3));
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_a0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
  while( true ) {
    compiler.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
    bVar2 = std::operator!=(&local_a0,(_Self *)((long)&compiler.field_2 + 8));
    if (!bVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_c8,"CMAKE_",(allocator *)((long)&l_1._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&l_1._M_node + 7));
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_a0);
    std::__cxx11::string::operator+=((string *)local_c8,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)local_c8,"_COMPILER");
    poVar5 = std::operator<<((ostream *)this->FlagFileStream,"# compile ");
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_a0);
    poVar5 = std::operator<<(poVar5,(string *)pbVar4);
    poVar5 = std::operator<<(poVar5," with ");
    pcVar3 = cmMakefile::GetSafeDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_c8);
    poVar5 = std::operator<<(poVar5,pcVar3);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)local_c8);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a0);
  }
  local_d8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
  while( true ) {
    flags.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
    bVar2 = std::operator!=(&local_d8,(_Self *)((long)&flags.field_2 + 8));
    if (!bVar2) break;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    cmCommonTargetGenerator::GetFlags
              ((string *)((long)&defines.field_2 + 8),&this->super_cmCommonTargetGenerator,pbVar4);
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    cmCommonTargetGenerator::GetDefines
              ((string *)((long)&includes.field_2 + 8),&this->super_cmCommonTargetGenerator,pbVar4);
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    cmCommonTargetGenerator::GetIncludes
              ((string *)local_140,&this->super_cmCommonTargetGenerator,pbVar4);
    cmsys::SystemTools::ReplaceString((string *)((long)&defines.field_2 + 8),"#","\\#");
    cmsys::SystemTools::ReplaceString((string *)((long)&includes.field_2 + 8),"#","\\#");
    cmsys::SystemTools::ReplaceString((string *)local_140,"#","\\#");
    pcVar1 = this->FlagFileStream;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    poVar5 = std::operator<<((ostream *)pcVar1,(string *)pbVar4);
    poVar5 = std::operator<<(poVar5,"_FLAGS = ");
    poVar5 = std::operator<<(poVar5,(string *)(defines.field_2._M_local_buf + 8));
    std::operator<<(poVar5,"\n\n");
    pcVar1 = this->FlagFileStream;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    poVar5 = std::operator<<((ostream *)pcVar1,(string *)pbVar4);
    poVar5 = std::operator<<(poVar5,"_DEFINES = ");
    poVar5 = std::operator<<(poVar5,(string *)(includes.field_2._M_local_buf + 8));
    std::operator<<(poVar5,"\n\n");
    pcVar1 = this->FlagFileStream;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_d8);
    poVar5 = std::operator<<((ostream *)pcVar1,(string *)pbVar4);
    poVar5 = std::operator<<(poVar5,"_INCLUDES = ");
    poVar5 = std::operator<<(poVar5,(string *)local_140);
    std::operator<<(poVar5,"\n\n");
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)(includes.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(defines.field_2._M_local_buf + 8));
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_d8);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetLanguageFlags()
{
  // write language flags for target
  std::set<std::string> languages;
  this->GeneratorTarget->GetLanguages(
    languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  // put the compiler in the rules.make file so that if it changes
  // things rebuild
  for (std::set<std::string>::const_iterator l = languages.begin();
       l != languages.end(); ++l) {
    std::string compiler = "CMAKE_";
    compiler += *l;
    compiler += "_COMPILER";
    *this->FlagFileStream << "# compile " << *l << " with "
                          << this->Makefile->GetSafeDefinition(compiler)
                          << "\n";
  }

  for (std::set<std::string>::const_iterator l = languages.begin();
       l != languages.end(); ++l) {
    std::string flags = this->GetFlags(*l);
    std::string defines = this->GetDefines(*l);
    std::string includes = this->GetIncludes(*l);
    // Escape comment characters so they do not terminate assignment.
    cmSystemTools::ReplaceString(flags, "#", "\\#");
    cmSystemTools::ReplaceString(defines, "#", "\\#");
    cmSystemTools::ReplaceString(includes, "#", "\\#");
    *this->FlagFileStream << *l << "_FLAGS = " << flags << "\n\n";
    *this->FlagFileStream << *l << "_DEFINES = " << defines << "\n\n";
    *this->FlagFileStream << *l << "_INCLUDES = " << includes << "\n\n";
  }
}